

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::CycleDelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  Expression *pEVar1;
  DelaySyntax *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ExpressionSyntax *pEVar6;
  undefined4 extraout_var;
  ConstantValue **this;
  Scope *scope;
  Symbol *pSVar7;
  SourceRange sourceRange;
  bitmask<slang::ast::ASTFlags> local_58;
  SourceRange local_50;
  Compilation *local_40;
  CycleDelayControl *result;
  Expression *local_30;
  Expression *expr;
  ASTContext *context_local;
  DelaySyntax *syntax_local;
  Compilation *compilation_local;
  
  expr = (Expression *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (DelaySyntax *)compilation;
  pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->delayValue);
  pEVar1 = expr;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
  iVar5 = Expression::bind((int)pEVar6,(sockaddr *)pEVar1,(socklen_t)result);
  pDVar2 = syntax_local;
  local_30 = (Expression *)CONCAT44(extraout_var,iVar5);
  local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_40 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::CycleDelayControl,slang::ast::Expression_const&,slang::SourceRange>
                       ((BumpAllocator *)pDVar2,(Expression *)CONCAT44(extraout_var,iVar5),&local_50
                       );
  bVar3 = ASTContext::requireIntegral((ASTContext *)expr,local_30);
  if (bVar3) {
    this = &expr->constant;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_58,LValue);
    bVar4 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)this,&local_58);
    pDVar2 = syntax_local;
    bVar3 = false;
    if (!bVar4) {
      scope = not_null<const_slang::ast::Scope_*>::operator*
                        ((not_null<const_slang::ast::Scope_*> *)expr);
      pSVar7 = Compilation::getDefaultClocking((Compilation *)pDVar2,scope);
      bVar3 = pSVar7 == (Symbol *)0x0;
    }
    pEVar1 = expr;
    if (bVar3) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
      ASTContext::addDiag((ASTContext *)pEVar1,(DiagCode)0x280008,sourceRange);
    }
    compilation_local = local_40;
  }
  else {
    compilation_local =
         (Compilation *)
         TimingControl::badCtrl((Compilation *)syntax_local,(TimingControl *)local_40);
  }
  return (TimingControl *)compilation_local;
}

Assistant:

TimingControl& CycleDelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                             const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<CycleDelayControl>(expr, syntax.sourceRange());

    if (!context.requireIntegral(expr))
        return badCtrl(compilation, result);

    if (!context.flags.has(ASTFlags::LValue) && !compilation.getDefaultClocking(*context.scope))
        context.addDiag(diag::NoDefaultClocking, syntax.sourceRange());

    return *result;
}